

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-client.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  undefined8 uVar1;
  anon_class_24_3_9716566c *__f;
  int port;
  Communicator client;
  string ip;
  uint local_64;
  Communicator local_60 [8];
  anon_class_24_3_9716566c local_58;
  code *local_40;
  string local_38;
  
  printf("Usage: %s ip port\n",*argv);
  if (argc < 3) {
    return -1;
  }
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"127.0.0.1","");
  local_64 = 0x2ee3;
  std::__cxx11::string::operator=((string *)&local_38,argv[1]);
  local_64 = atoi(argv[2]);
  printf("Connecting to %s : %d\n",local_38._M_dataplus._M_p,(ulong)local_64);
  GGSock::Communicator::Communicator(local_60,false);
  local_58.client = (Communicator *)0x0;
  local_58.ip = (string *)0x0;
  local_40 = std::
             _Function_handler<unsigned_short_(const_char_*,_unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/ggerganov[P]ggsock/tools/test-client.cpp:36:35)>
             ::_M_invoke;
  local_58.port =
       (int *)std::
              _Function_handler<unsigned_short_(const_char_*,_unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/ggerganov[P]ggsock/tools/test-client.cpp:36:35)>
              ::_M_manager;
  GGSock::Communicator::setMessageCallback((ushort)local_60,(function *)0x5f);
  if ((code *)local_58.port != (code *)0x0) {
    (*(code *)local_58.port)(&local_58,&local_58,3);
  }
  local_58.client = (Communicator *)0x0;
  local_58.ip = (string *)0x0;
  local_40 = std::
             _Function_handler<unsigned_short_(const_char_*,_unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/ggerganov[P]ggsock/tools/test-client.cpp:40:35)>
             ::_M_invoke;
  local_58.port =
       (int *)std::
              _Function_handler<unsigned_short_(const_char_*,_unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/ggerganov[P]ggsock/tools/test-client.cpp:40:35)>
              ::_M_manager;
  __f = (anon_class_24_3_9716566c *)0x5e;
  GGSock::Communicator::setMessageCallback((ushort)local_60,(function *)0x5e);
  if ((code *)local_58.port != (code *)0x0) {
    __f = &local_58;
    (*(code *)local_58.port)(__f,__f,3);
  }
  local_58.port = (int *)&local_64;
  local_58.client = local_60;
  local_58.ip = &local_38;
  std::function<void()>::operator=((function<void()> *)&local_58,__f);
  if (g_update.super__Function_base._M_manager != (_Manager_type)0x0) {
    do {
      (*g_update._M_invoker)((_Any_data *)&g_update);
      local_58.client = (Communicator *)0x64;
      std::this_thread::sleep_for<long,std::ratio<1l,1000l>>
                ((duration<long,_std::ratio<1L,_1000L>_> *)&local_58);
    } while (g_update.super__Function_base._M_manager != (_Manager_type)0x0);
  }
  uVar1 = std::__throw_bad_function_call();
  GGSock::Communicator::~Communicator(local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  _Unwind_Resume(uVar1);
}

Assistant:

int main(int argc, char ** argv) {
    printf("Usage: %s ip port\n", argv[0]);
    if (argc < 3) {
        return -1;
    }

    std::string ip = "127.0.0.1";
    int port = 12003;

    if (argc > 1) ip = argv[1];
    if (argc > 2) port = atoi(argv[2]);

    printf("Connecting to %s : %d\n", ip.c_str(), port);

    GGSock::Communicator client(false);

    client.setMessageCallback(95, [](const char * , size_t ) {
        printf("Received message 95\n");
        return 0;
    });
    client.setMessageCallback(94, [](const char * , size_t dataSize) {
        printf("Received message 94, dataSize = %d\n", (int) dataSize);
        return 0;
    });

    g_update = [&]() {
        if (client.connect(ip, port, 0)) {
            printf("Started connecting ...\n");
        }

        if (client.isConnected()) {
            client.send(195);
        }

        client.update();
    };


#ifdef __EMSCRIPTEN__
    emscripten_set_main_loop(update, 0, 1);
#else
    while(true) {
        update();
        std::this_thread::sleep_for(std::chrono::milliseconds(100));
    }
#endif

    return 0;
}